

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::plus_<jsonip::parser::digit_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = cirange_<(char)48,(char)57>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state);
  bVar2 = bVar1;
  while( true ) {
    if (bVar2 == false) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) break;
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    if (!bVar2) {
      return bVar1;
    }
    bVar2 = cirange_<(char)48,(char)57>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
  }
  return bVar1;
}

Assistant:

static inline bool match(S& state)
        {
            if (!C0::match(state)) return false;
            // Note: yes, I unroll this loop intentionally
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }